

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnSetTXTModel(XL *out,char *model_path)

{
  XL pvVar1;
  allocator local_31;
  string local_30 [32];
  
  pvVar1 = *out;
  std::__cxx11::string::string(local_30,model_path,&local_31);
  std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x180),local_30);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

XL_DLL int XLearnSetTXTModel(XL *out, const char *model_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().txt_model_file = std::string(model_path);
  API_END();
}